

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcherStack.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XPathMatcherStack::XPathMatcherStack(XPathMatcherStack *this,MemoryManager *manager)

{
  int iVar1;
  XMLSize_t index;
  ValueStackOf<int> *pVVar2;
  undefined4 extraout_var;
  RefVectorOf<xercesc_4_0::XPathMatcher> *pRVar3;
  undefined4 extraout_var_00;
  long lVar4;
  CleanupType_conflict27 cleanup;
  JanitorMemFunCall<xercesc_4_0::XPathMatcherStack> local_38;
  
  this->fMatchersCount = 0;
  this->fContextStack = (ValueStackOf<int> *)0x0;
  this->fMatchers = (RefVectorOf<xercesc_4_0::XPathMatcher> *)0x0;
  local_38.fToCall = (MFPT)cleanUp;
  local_38._16_8_ = 0;
  local_38.fObject = this;
  pVVar2 = (ValueStackOf<int> *)XMemory::operator_new(0x30,manager);
  (pVVar2->fVector).fCallDestructor = false;
  (pVVar2->fVector).fCurCount = 0;
  (pVVar2->fVector).fMaxCount = 8;
  (pVVar2->fVector).fElemList = (int *)0x0;
  (pVVar2->fVector).fMemoryManager = manager;
  iVar1 = (*manager->_vptr_MemoryManager[3])(manager);
  (pVVar2->fVector).fElemList = (int *)CONCAT44(extraout_var,iVar1);
  memset((int *)CONCAT44(extraout_var,iVar1),0,(pVVar2->fVector).fMaxCount << 2);
  this->fContextStack = pVVar2;
  pRVar3 = (RefVectorOf<xercesc_4_0::XPathMatcher> *)XMemory::operator_new(0x30,manager);
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::XPathMatcher>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__BaseRefVectorOf_0041be30;
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::XPathMatcher>).fAdoptedElems = true;
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::XPathMatcher>).fCurCount = 0;
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::XPathMatcher>).fMaxCount = 8;
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::XPathMatcher>).fElemList = (XPathMatcher **)0x0;
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::XPathMatcher>).fMemoryManager = manager;
  iVar1 = (*manager->_vptr_MemoryManager[3])(manager,0x40);
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::XPathMatcher>).fElemList =
       (XPathMatcher **)CONCAT44(extraout_var_00,iVar1);
  lVar4 = 0;
  do {
    (pRVar3->super_BaseRefVectorOf<xercesc_4_0::XPathMatcher>).fElemList[lVar4] =
         (XPathMatcher *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  (pRVar3->super_BaseRefVectorOf<xercesc_4_0::XPathMatcher>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__RefVectorOf_0041bdb8;
  this->fMatchers = pRVar3;
  local_38.fObject = (XPathMatcherStack *)0x0;
  JanitorMemFunCall<xercesc_4_0::XPathMatcherStack>::~JanitorMemFunCall(&local_38);
  return;
}

Assistant:

XPathMatcherStack::XPathMatcherStack(MemoryManager* const manager)
    : fMatchersCount(0)
    , fContextStack(0)
    , fMatchers(0)
{
    CleanupType cleanup(this, &XPathMatcherStack::cleanUp);

    try {
        fContextStack = new (manager) ValueStackOf<int>(8, manager);
        fMatchers = new (manager) RefVectorOf<XPathMatcher>(8, true, manager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}